

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::DecimalFormat::format
          (DecimalFormat *this,StringPiece number,UnicodeString *appendTo,
          FieldPositionIterator *posIter,UErrorCode *status)

{
  int32_t offset;
  LocalizedNumberFormatter *pLVar1;
  StringPiece value;
  undefined1 local_78 [8];
  UnicodeStringAppendable appendable;
  undefined1 local_48 [8];
  FormattedNumber output;
  UErrorCode *status_local;
  FieldPositionIterator *posIter_local;
  UnicodeString *appendTo_local;
  DecimalFormat *this_local;
  StringPiece number_local;
  
  output._8_8_ = status;
  pLVar1 = LocalPointerBase<const_icu_63::number::LocalizedNumberFormatter>::operator->
                     (&(this->fields->formatter).
                       super_LocalPointerBase<const_icu_63::number::LocalizedNumberFormatter>);
  value._8_8_ = number.ptr_;
  value.ptr_ = (char *)pLVar1;
  icu_63::number::LocalizedNumberFormatter::formatDecimal
            ((LocalizedNumberFormatter *)local_48,value,(UErrorCode *)(ulong)(uint)number.length_);
  offset = UnicodeString::length(appendTo);
  fieldPositionIteratorHelper((FormattedNumber *)local_48,posIter,offset,(UErrorCode *)output._8_8_)
  ;
  UnicodeStringAppendable::UnicodeStringAppendable((UnicodeStringAppendable *)local_78,appendTo);
  icu_63::number::FormattedNumber::appendTo((FormattedNumber *)local_48,(Appendable *)local_78);
  UnicodeStringAppendable::~UnicodeStringAppendable((UnicodeStringAppendable *)local_78);
  icu_63::number::FormattedNumber::~FormattedNumber((FormattedNumber *)local_48);
  return appendTo;
}

Assistant:

UnicodeString&
DecimalFormat::format(StringPiece number, UnicodeString& appendTo, FieldPositionIterator* posIter,
                      UErrorCode& status) const {
    FormattedNumber output = fields->formatter->formatDecimal(number, status);
    fieldPositionIteratorHelper(output, posIter, appendTo.length(), status);
    auto appendable = UnicodeStringAppendable(appendTo);
    output.appendTo(appendable);
    return appendTo;
}